

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

ElementsDecodeRawTransactionTxInStruct * __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxIn::ConvertToStruct
          (ElementsDecodeRawTransactionTxInStruct *__return_storage_ptr__,
          ElementsDecodeRawTransactionTxIn *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_198 [32];
  _Alloc_hider local_178;
  char local_168 [16];
  undefined1 local_158 [32];
  _Base_ptr p_Stack_138;
  _Alloc_hider local_130;
  string local_110 [32];
  int64_t local_f0;
  string local_e8 [32];
  int64_t local_c8;
  string local_c0 [32];
  string asStack_a0 [32];
  string asStack_80 [40];
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  ElementsDecodeRawTransactionTxInStruct::ElementsDecodeRawTransactionTxInStruct
            (__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->txid);
  __return_storage_ptr__->vout = this->vout_;
  ElementsDecodeUnlockingScript::ConvertToStruct
            ((ElementsDecodeUnlockingScriptStruct *)local_198,&this->script_sig_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->script_sig,(string *)local_198)
  ;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_sig).hex,(string *)&local_178);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->script_sig).ignore_items._M_t);
  if ((_Base_ptr)local_158._16_8_ != (_Base_ptr)0x0) {
    (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_158._8_4_;
    (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)local_158._16_8_;
    (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = (_Base_ptr)local_158._24_8_;
    (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = p_Stack_138;
    *(_Rb_tree_header **)(local_158._16_8_ + 8) =
         &(__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = (size_t)local_130._M_p;
    local_158._16_8_ = (_Base_ptr)0x0;
    local_130._M_p = (pointer)0x0;
    local_158._24_8_ = (_Base_ptr)(local_158 + 8);
    p_Stack_138 = (_Base_ptr)(local_158 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_158);
  if (local_178._M_p != local_168) {
    operator_delete(local_178._M_p);
  }
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_);
  }
  __return_storage_ptr__->is_pegin = this->is_pegin_;
  __return_storage_ptr__->sequence = this->sequence_;
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct(&local_1b8,&this->txinwitness_);
  local_198._16_8_ =
       (__return_storage_ptr__->txinwitness).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->txinwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_198._0_8_ =
       (__return_storage_ptr__->txinwitness).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_198._8_8_ =
       (__return_storage_ptr__->txinwitness).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->txinwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->txinwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct(&local_1b8,&this->pegin_witness_);
  local_198._16_8_ =
       (__return_storage_ptr__->pegin_witness).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->pegin_witness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_198._0_8_ =
       (__return_storage_ptr__->pegin_witness).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_198._8_8_ =
       (__return_storage_ptr__->pegin_witness).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->pegin_witness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->pegin_witness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  ElementsDecodeIssuance::ConvertToStruct
            ((ElementsDecodeIssuanceStruct *)local_198,&this->issuance_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->issuance,(string *)local_198);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->issuance).asset_entropy,(string *)&local_178);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->issuance).contract_hash,(string *)local_158);
  (__return_storage_ptr__->issuance).isreissuance = p_Stack_138._0_1_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->issuance).token,(string *)&local_130);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->issuance).asset,local_110);
  (__return_storage_ptr__->issuance).assetamount = local_f0;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->issuance).assetamountcommitment,local_e8);
  (__return_storage_ptr__->issuance).tokenamount = local_c8;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->issuance).tokenamountcommitment,local_c0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->issuance).asset_rangeproof,asStack_a0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->issuance).token_rangeproof,asStack_80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->issuance).ignore_items._M_t);
  if (local_58._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->issuance).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_58._M_color;
    (__return_storage_ptr__->issuance).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_58._M_parent;
    (__return_storage_ptr__->issuance).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = local_58._M_left;
    (__return_storage_ptr__->issuance).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_58._M_right;
    (local_58._M_parent)->_M_parent =
         &(__return_storage_ptr__->issuance).ignore_items._M_t._M_impl.super__Rb_tree_header.
          _M_header;
    (__return_storage_ptr__->issuance).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count
         = local_38;
    local_58._M_parent = (_Base_ptr)0x0;
    local_38 = 0;
    local_58._M_left = &local_58;
    local_58._M_right = &local_58;
  }
  ElementsDecodeIssuanceStruct::~ElementsDecodeIssuanceStruct
            ((ElementsDecodeIssuanceStruct *)local_198);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

ElementsDecodeRawTransactionTxInStruct ElementsDecodeRawTransactionTxIn::ConvertToStruct() const {  // NOLINT
  ElementsDecodeRawTransactionTxInStruct result;
  result.coinbase = coinbase_;
  result.txid = txid_;
  result.vout = vout_;
  result.script_sig = script_sig_.ConvertToStruct();
  result.is_pegin = is_pegin_;
  result.sequence = sequence_;
  result.txinwitness = txinwitness_.ConvertToStruct();
  result.pegin_witness = pegin_witness_.ConvertToStruct();
  result.issuance = issuance_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}